

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDP_Solver.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  ostream *poVar3;
  NullPlanner *this;
  MDPValueIteration *this_00;
  MDPPolicyIteration *this_01;
  undefined8 in_RSI;
  undefined4 in_EDI;
  vector<double,_std::allocator<double>_> *this_02;
  E *e;
  double r;
  vector<double,_std::allocator<double>_> avgRewards;
  SimulationDecPOMDPDiscrete sim;
  int seed;
  int nrRuns;
  QTable q;
  stringstream ss;
  string timingsFilename;
  string filename;
  string methodName;
  MDPSolver *mdpSolver;
  PlanningUnitDecPOMDPDiscrete *np;
  DecPOMDPDiscreteInterface *decpomdp;
  Timing Time;
  Arguments args;
  char *in_stack_fffffffffffff8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8d8;
  allocator<char> *in_stack_fffffffffffff8e0;
  char *in_stack_fffffffffffff8e8;
  Arguments *in_stack_fffffffffffff8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  Arguments *np_00;
  QTable *in_stack_fffffffffffff9c0;
  string local_638 [32];
  vector<double,_std::allocator<double>_> *local_618;
  string local_5f8 [32];
  SimulationDecPOMDPDiscrete local_5d8 [80];
  int local_588;
  int local_584;
  undefined1 local_580 [24];
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa98;
  string *in_stack_fffffffffffffab0;
  string local_548 [39];
  allocator<char> local_521;
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  stringstream local_4a0 [16];
  ostream local_490 [383];
  allocator<char> local_311;
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8 [32];
  string local_2c8 [32];
  MDPValueIteration *local_2a8;
  NullPlanner *local_2a0;
  DecPOMDPDiscreteInterface *local_298;
  Timing local_290 [72];
  Arguments local_248;
  undefined8 local_10;
  undefined4 local_8;
  int local_4;
  
  local_4 = 0;
  np_00 = &local_248;
  local_10 = in_RSI;
  local_8 = in_EDI;
  ArgumentHandlers::Arguments::Arguments(in_stack_fffffffffffff8f0);
  argp_parse(ArgumentHandlers::theArgpStruc,local_8,local_10,0,0,np_00);
  Timing::Timing(local_290);
  poVar2 = std::operator<<((ostream *)&std::cout,"Instantiating the problem...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_298 = (DecPOMDPDiscreteInterface *)
              ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&local_248);
  poVar3 = std::operator<<((ostream *)&std::cout,"...done.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  this = (NullPlanner *)operator_new(0x338);
  NullPlanner::NullPlanner
            (this,(long)local_248.horizon,local_298,(PlanningUnitMADPDiscreteParameters *)0x0);
  local_2a8 = (MDPValueIteration *)0x0;
  local_2a0 = this;
  std::__cxx11::string::string(local_2c8);
  if (local_248.mmdp_method == ValueIteration) {
    this_00 = (MDPValueIteration *)operator_new(0x40);
    MDPValueIteration::MDPValueIteration(this_00,(PlanningUnitDecPOMDPDiscrete *)local_2a0);
    local_2a8 = this_00;
    std::__cxx11::string::operator=(local_2c8,"MMDP_Solver_VI");
    poVar3 = std::operator<<((ostream *)&std::cout,"Running value iteration...");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    if (local_248.mmdp_method != PolicyIteration) {
      if (local_248.mmdp_method != PolicyIterationGPU) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Unkown mmdp_method");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "No \'MDPPolicyIterationGPU\' available. Install cuda, reconfigure and recompile."
                              );
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    this_01 = (MDPPolicyIteration *)operator_new(0x40);
    MDPPolicyIteration::MDPPolicyIteration(this_01,(PlanningUnitDecPOMDPDiscrete *)local_2a0);
    local_2a8 = (MDPValueIteration *)this_01;
    poVar3 = std::operator<<((ostream *)&std::cout,"Running policy iteration...");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::operator=(local_2c8,"MMDP_Solver_PI");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
  std::allocator<char>::~allocator(&local_311);
  if (local_248.dryrun == 0) {
    std::__cxx11::stringstream::stringstream(local_4a0);
    directories::MADPGetResultsFilename
              (local_4c0,(MultiAgentDecisionProcessInterface *)local_2c8,
               (Arguments *)(local_298 + *(long *)(*(long *)local_298 + -0x40)));
    poVar3 = std::operator<<(local_490,local_4c0);
    poVar3 = std::operator<<(poVar3,"_h");
    std::ostream::operator<<(poVar3,local_248.horizon);
    std::__cxx11::string::~string(local_4c0);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=(local_2e8,local_4e0);
    std::__cxx11::string::~string(local_4e0);
    std::operator+(in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
    std::__cxx11::string::operator=(local_310,local_500);
    std::__cxx11::string::~string(local_500);
    bVar1 = file_exists(in_stack_fffffffffffffab0);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"MMDP_Solver: could not open ");
      poVar3 = std::operator<<(poVar3,local_2e8);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"Results will not be stored to disk.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_248.dryrun = 1;
    }
    std::__cxx11::stringstream::~stringstream(local_4a0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
  Timing::Start((string *)local_290);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator(&local_521);
  (**(code **)(*(long *)local_2a8 + 0x10))();
  this_03 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xfffffffffffffab7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_03,in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
  Timing::Stop((string *)local_290);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffab7);
  poVar3 = std::operator<<((ostream *)&std::cout,"...done.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  (**(code **)(*(long *)local_2a8 + 0x50))(local_580,local_2a8,0);
  local_584 = local_248.nrRuns;
  local_588 = local_248.randomSeed;
  poVar3 = std::operator<<((ostream *)&std::cout,"Simulating policy with nrRuns: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_584);
  poVar3 = std::operator<<(poVar3," and seed: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_588);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  SimulationDecPOMDPDiscrete::SimulationDecPOMDPDiscrete
            (local_5d8,(PlanningUnitDecPOMDPDiscrete *)local_2a0,local_584,local_588,false);
  if (local_248.dryrun == 0) {
    std::__cxx11::string::string(local_5f8,local_2e8);
    SimulationDecPOMDPDiscrete::SaveIntermediateResults(local_5d8,local_5f8);
    std::__cxx11::string::~string(local_5f8);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x107f7f);
  this_02 = (vector<double,_std::allocator<double>_> *)
            runOneSimulation(in_stack_fffffffffffff9c0,(PlanningUnitDecPOMDPDiscrete *)np_00,
                             (SimulationDecPOMDPDiscrete *)poVar2);
  local_618 = this_02;
  poVar2 = std::operator<<((ostream *)&std::cout,"...done");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<double,_std::allocator<double>_>::push_back(this_02,(value_type_conflict *)poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Avg rewards: ");
  PrintTools::SoftPrintVector<double>(in_stack_fffffffffffffa98);
  poVar3 = std::operator<<(poVar2,local_638);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_638);
  if (local_248.dryrun == 0) {
    Timing::Save((string *)local_290);
  }
  std::vector<double,_std::allocator<double>_>::~vector(this_02);
  SimulationDecPOMDPDiscrete::~SimulationDecPOMDPDiscrete(local_5d8);
  QTable::~QTable((QTable *)poVar2);
  std::__cxx11::string::~string(local_310);
  std::__cxx11::string::~string(local_2e8);
  std::__cxx11::string::~string(local_2c8);
  Timing::~Timing(local_290);
  local_4 = 0;
  ArgumentHandlers::Arguments::~Arguments((Arguments *)0x1081ce);
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    try
    {
        Timing Time;
        cout << "Instantiating the problem..."<<endl;
        DecPOMDPDiscreteInterface* decpomdp = GetDecPOMDPDiscreteInterfaceFromArgs(args);
        cout << "...done."<<endl;

        //construct MMDP_Solver
        PlanningUnitDecPOMDPDiscrete *np = new NullPlanner(args.horizon, decpomdp);
        MDPSolver *mdpSolver=NULL;
        string methodName;
        switch (args.mmdp_method)
        {
        case ArgumentHandlers::ValueIteration:
            mdpSolver=new MDPValueIteration(*np);
            methodName="MMDP_Solver_VI";
            cout << "Running value iteration..."<<endl;
            break;
        case ArgumentHandlers::PolicyIteration:
            mdpSolver=new MDPPolicyIteration(*np);
            cout << "Running policy iteration..."<<endl;
            methodName="MMDP_Solver_PI";
            break;
        case ArgumentHandlers::PolicyIterationGPU:
#if HAVE_CUDA_CUSOLVERDN_H
            mdpSolver=new MDPPolicyIterationGPU(*np);
            cout << "Running GPU supported policy iteration..."<<endl;
            methodName="MMDP_Solver_PIgpu";
#else
            cerr<<"No 'MDPPolicyIterationGPU' available. Install cuda, reconfigure and recompile."<<endl;
            exit(1);
#endif
            break;
        default:
            cerr<<"Unkown mmdp_method"<<endl;
            exit(1);
        }

        //set up output files
        string filename="/dev/null", timingsFilename="/dev/null";
        if(!args.dryrun)
        {
            stringstream ss;
            ss  << directories::MADPGetResultsFilename(methodName, *decpomdp, args)
                << "_h" << args.horizon;
            filename=ss.str();
            timingsFilename=filename + "_Timings";
            if(!file_exists(filename))
            {
                cout << "MMDP_Solver: could not open " << filename <<endl;
                cout << "Results will not be stored to disk." <<endl;
                args.dryrun = true;
            }
        }

        //start planning
        Time.Start("Plan");
        mdpSolver->Plan(); // calls PlanSlow() on MDPPolicyIteration and MDPPolicyIterationGPU objects

        Time.Stop("Plan");
        cout << "...done."<<endl;
        QTable q = mdpSolver->GetQTable(0); //<- infinite horizon, so get 1 value function of stage 0

        int nrRuns = args.nrRuns; //defaults to 1000, see argumentHandlers.h
        int seed = args.randomSeed; //defaults to 42
        cout << "Simulating policy with nrRuns: " << nrRuns << " and seed: " << seed <<endl;
        SimulationDecPOMDPDiscrete sim(*np, nrRuns, seed);

        //write intermediate simulation results to file
        if(!args.dryrun)
            sim.SaveIntermediateResults(filename);

        vector<double> avgRewards;
        double r = runOneSimulation(q, np, sim);
        cout << "...done"<<endl;

        avgRewards.push_back(r);
        cout << "Avg rewards: " << SoftPrintVector(avgRewards) << endl;

        //write MDPSOLVER timing information to file
        if(!args.dryrun)
            Time.Save(timingsFilename);
    }
    catch(E& e){ e.Print(); }

    return(0);
}